

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int declaration_specifiers(sym_t *s)

{
  int iVar1;
  socklen_t *in_RDX;
  socklen_t *__addr_len;
  socklen_t *__addr_len_00;
  sockaddr *in_RSI;
  
  iVar1 = accept(0x80,in_RSI,in_RDX);
  if (iVar1 == 0) {
    iVar1 = accept(0x84,in_RSI,__addr_len);
    if (iVar1 == 0) {
      iVar1 = accept(0x85,in_RSI,__addr_len_00);
      if (iVar1 == 0) {
        return 0;
      }
      if (s->type_id == 0) {
        s->type_id = 0x85;
        goto LAB_00105501;
      }
    }
    else if (s->type_id == 0) {
      s->type_id = 0x84;
      goto LAB_00105501;
    }
  }
  else if (s->type_id == 0) {
    s->type_id = 0x80;
    goto LAB_00105501;
  }
  err(E,"two or more data types in declaration specifiers");
LAB_00105501:
  do {
    iVar1 = declaration_specifiers(s);
  } while (iVar1 != 0);
  return 1;
}

Assistant:

int declaration_specifiers(sym_t* s)
{
    if (type_specifier(s))
    {
        while (declaration_specifiers(s))
            ;
        return 1;
    }

    return 0;
}